

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pAngle.cpp
# Opt level: O0

void __thiscall
OpenMD::pAngle::pAngle
          (pAngle *this,SimInfo *info,string *filename,string *sele1,string *sele2,int nthetabins)

{
  undefined1 uVar1;
  bool bVar2;
  string *in_RCX;
  SimInfo *in_RDX;
  SelectionEvaluator *in_RSI;
  SelectionEvaluator *in_RDI;
  string *in_R8;
  undefined4 in_R9D;
  SimInfo *in_stack_00000198;
  SelectionManager *in_stack_000001a0;
  string *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  SimInfo *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  pointer *__new_size;
  pointer *this_00;
  SelectionEvaluator *this_01;
  string *script;
  string local_80 [32];
  string local_60 [52];
  undefined4 local_2c;
  string *local_28;
  string *local_20;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            ((StaticAnalyser *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8,
             (string *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             (uint)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  *(undefined ***)&(in_RDI->compiler).filename = &PTR__pAngle_0055fd20;
  *(undefined1 *)&(in_RDI->compiler).cchScript = 0;
  *(undefined1 *)((long)&(in_RDI->compiler).cchScript + 1) = 0;
  std::__cxx11::string::string((string *)&(in_RDI->compiler).ichToken,local_20);
  script = (string *)&(in_RDI->compiler).ichCurrentCommand;
  std::__cxx11::string::string((string *)script,local_28);
  SelectionManager::SelectionManager(in_stack_000001a0,in_stack_00000198);
  this_01 = (SelectionEvaluator *)((long)&(in_RDI->errorMessage).field_2 + 8);
  SelectionManager::SelectionManager(in_stack_000001a0,in_stack_00000198);
  SelectionEvaluator::SelectionEvaluator(in_RSI,in_RDX);
  SelectionEvaluator::SelectionEvaluator(in_RSI,in_RDX);
  *(undefined4 *)
   ((long)&in_RDI[2].distanceFinder.inversions_.
           super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = local_2c;
  __new_size = &in_RDI[2].distanceFinder.inversions_.
                super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x19ea6b);
  this_00 = &in_RDI[2].distanceFinder.molecules_.
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x19ea81);
  getPrefix((string *)in_stack_fffffffffffffef8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffef8,
                 (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  StaticAnalyser::setOutputName
            ((StaticAnalyser *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffee8);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  SelectionEvaluator::loadScriptString(in_RDI,script);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)&(in_RDI->distanceFinder).inversions_)
  ;
  if (!(bool)uVar1) {
    in_stack_fffffffffffffef8 = (SimInfo *)&(in_RDI->compiler).atokenInfix;
    SelectionEvaluator::evaluate(this_01);
    SelectionManager::setSelectionSet
              ((SelectionManager *)CONCAT17(uVar1,in_stack_ffffffffffffff00),
               (SelectionSet *)in_stack_fffffffffffffef8);
    SelectionSet::~SelectionSet((SelectionSet *)0x19eb6e);
  }
  SelectionEvaluator::loadScriptString(in_RDI,script);
  bVar2 = SelectionEvaluator::isDynamic((SelectionEvaluator *)&in_RDI[1].distanceFinder.inversions_)
  ;
  if (!bVar2) {
    SelectionEvaluator::evaluate(this_01);
    SelectionManager::setSelectionSet
              ((SelectionManager *)CONCAT17(uVar1,in_stack_ffffffffffffff00),
               (SelectionSet *)in_stack_fffffffffffffef8);
    SelectionSet::~SelectionSet((SelectionSet *)0x19ed0c);
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_00,(size_type)__new_size);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this_00,(size_type)__new_size);
  return;
}

Assistant:

pAngle::pAngle(SimInfo* info, const std::string& filename,
                 const std::string& sele1, const std::string& sele2,
                 int nthetabins) :
      StaticAnalyser(info, filename, nthetabins),
      doVect_(false), doOffset_(false), selectionScript1_(sele1),
      selectionScript2_(sele2), seleMan1_(info), seleMan2_(info),
      evaluator1_(info), evaluator2_(info), nThetaBins_(nthetabins) {
    setOutputName(getPrefix(filename) + ".pAngle");

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    evaluator2_.loadScriptString(sele2);
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }

    count_.resize(nThetaBins_);
    histogram_.resize(nThetaBins_);
  }